

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjDelete_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int fFreeTop)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  int fFreeTop_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0xeb,"void Aig_ObjDelete_rec(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsConst1(pObj);
  if ((iVar1 == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) {
    iVar1 = Aig_ObjIsCo(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Aig_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                    ,0xee,"void Aig_ObjDelete_rec(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pObj_00 = Aig_ObjFanin0(pObj);
    pObj_01 = Aig_ObjFanin1(pObj);
    Aig_ObjDisconnect(p,pObj);
    if (fFreeTop != 0) {
      Aig_ObjDelete(p,pObj);
    }
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNone(pObj_00), iVar1 == 0)) &&
       (iVar1 = Aig_ObjRefs(pObj_00), iVar1 == 0)) {
      Aig_ObjDelete_rec(p,pObj_00,1);
    }
    if (((pObj_01 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNone(pObj_01), iVar1 == 0)) &&
       (iVar1 = Aig_ObjRefs(pObj_01), iVar1 == 0)) {
      Aig_ObjDelete_rec(p,pObj_01,1);
    }
  }
  return;
}

Assistant:

void Aig_ObjDelete_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int fFreeTop )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsConst1(pObj) || Aig_ObjIsCi(pObj) )
        return;
    assert( !Aig_ObjIsCo(pObj) );
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    Aig_ObjDisconnect( p, pObj );
    if ( fFreeTop )
        Aig_ObjDelete( p, pObj );
    if ( pFanin0 && !Aig_ObjIsNone(pFanin0) && Aig_ObjRefs(pFanin0) == 0 )
        Aig_ObjDelete_rec( p, pFanin0, 1 );
    if ( pFanin1 && !Aig_ObjIsNone(pFanin1) && Aig_ObjRefs(pFanin1) == 0 )
        Aig_ObjDelete_rec( p, pFanin1, 1 );
}